

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptArray * __thiscall
Js::JavascriptLibrary::CreateArray(JavascriptLibrary *this,uint32 length,uint32 size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptArray *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->arrayType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x178a,"(arrayType)","Where\'s arrayType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_50 = (undefined1  [8])&JavascriptArray::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x178b;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  this_00 = (JavascriptArray *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
  JavascriptArray::JavascriptArray(this_00,length,size,(this->arrayType).ptr);
  JavascriptArray::CheckForceES5Array(this_00);
  return this_00;
}

Assistant:

JavascriptArray* JavascriptLibrary::CreateArray(uint32 length, uint32 size)
    {
        AssertMsg(arrayType, "Where's arrayType?");
        JavascriptArray* arr = RecyclerNew(this->GetRecycler(), JavascriptArray, length, size, arrayType);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_ARRAY(arr));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif
        return arr;
    }